

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DebugRenderViewportThumbnail(ImDrawList *draw_list,ImGuiViewportP *viewport,ImRect *bb)

{
  ImVec2 IVar1;
  ImDrawList *pIVar2;
  ImGuiWindow *this;
  ImFont *font;
  char *text;
  undefined1 auVar3 [16];
  float fVar4;
  ImGuiContext *pIVar5;
  ImGuiWindow *pIVar6;
  ImVec2 *p_max;
  ImU32 IVar7;
  char *text_end;
  ImGuiWindow **ppIVar8;
  long lVar9;
  long lVar10;
  uint idx;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  ImRect IVar15;
  ImRect local_b8;
  float local_a4;
  ImGuiWindow *local_a0;
  ImRect local_98;
  ImDrawList *local_88;
  ImGuiViewportP *local_80;
  ImVec2 *local_78;
  long local_70;
  ImGuiWindow **local_68;
  ImRect *local_60;
  undefined1 local_58 [16];
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  pIVar5 = GImGui;
  local_a0 = GImGui->CurrentWindow;
  local_48 = (bb->Min).x;
  fStack_44 = (bb->Min).y;
  auVar14._0_4_ = (bb->Max).x - local_48;
  auVar14._4_4_ = (bb->Max).y - fStack_44;
  auVar14._8_8_ = 0;
  IVar1 = (viewport->super_ImGuiViewport).Pos;
  auVar3._8_8_ = 0;
  auVar3._0_4_ = (viewport->super_ImGuiViewport).Size.x;
  auVar3._4_4_ = (viewport->super_ImGuiViewport).Size.y;
  local_58 = divps(auVar14,auVar3);
  local_48 = local_48 - IVar1.x * local_58._0_4_;
  fStack_44 = fStack_44 - IVar1.y * local_58._4_4_;
  fStack_40 = 0.0 - local_58._8_4_ * 0.0;
  fStack_3c = 0.0 - local_58._12_4_ * 0.0;
  pIVar2 = local_a0->DrawList;
  local_88 = draw_list;
  local_80 = viewport;
  IVar7 = GetColorU32(5,0.4);
  local_78 = &bb->Max;
  ImDrawList::AddRectFilled(pIVar2,&bb->Min,&bb->Max,IVar7,0.0,0);
  ppIVar8 = (pIVar5->Windows).Data;
  lVar9 = (long)(pIVar5->Windows).Size << 3;
  local_70 = lVar9;
  local_68 = ppIVar8;
  local_60 = bb;
  for (lVar10 = 0; lVar9 != lVar10; lVar10 = lVar10 + 8) {
    this = *(ImGuiWindow **)((long)ppIVar8 + lVar10);
    if ((this->WasActive == true) && ((this->Flags & 0x1000000) == 0)) {
      local_b8 = ImGuiWindow::Rect(this);
      IVar15 = ImGuiWindow::TitleBarRect(this);
      fVar11 = IVar15.Min.y;
      fVar12 = local_b8.Min.x;
      fVar13 = local_b8.Max.x;
      fVar4 = local_b8.Max.y;
      local_b8.Min.y = (float)(int)(local_b8.Min.y * (float)local_58._4_4_ + fStack_44);
      local_b8.Min.x = (float)(int)(fVar12 * (float)local_58._0_4_ + local_48);
      local_b8.Max.x = (float)(int)(fVar13 * (float)local_58._0_4_ + local_48);
      local_b8.Max.y = (float)(int)(fVar4 * (float)local_58._4_4_ + fStack_44);
      local_98.Min.x = (float)(int)((float)local_58._0_4_ * IVar15.Min.x + local_48);
      local_98.Min.y = (float)(int)((float)local_58._4_4_ * fVar11 + fStack_44);
      local_98.Max.x = (float)(int)(IVar15.Max.x * (float)local_58._0_4_ + local_48);
      local_98.Max.y =
           (float)(int)(((IVar15.Max.y - fVar11) * 3.0 + fVar11) * (float)local_58._4_4_ + fStack_44
                       );
      ImRect::ClipWithFull(&local_b8,bb);
      ImRect::ClipWithFull(&local_98,bb);
      pIVar6 = local_a0;
      idx = 10;
      if (pIVar5->NavWindow != (ImGuiWindow *)0x0) {
        idx = this->RootWindowForTitleBarHighlight ==
              pIVar5->NavWindow->RootWindowForTitleBarHighlight | 10;
      }
      pIVar2 = local_a0->DrawList;
      IVar7 = GetColorU32(2,1.0);
      ImDrawList::AddRectFilled(pIVar2,&local_b8.Min,&local_b8.Max,IVar7,0.0,0);
      pIVar2 = pIVar6->DrawList;
      IVar7 = GetColorU32(idx,1.0);
      ImDrawList::AddRectFilled(pIVar2,&local_98.Min,&local_98.Max,IVar7,0.0,0);
      pIVar2 = pIVar6->DrawList;
      IVar7 = GetColorU32(5,1.0);
      ImDrawList::AddRect(pIVar2,&local_b8.Min,&local_b8.Max,IVar7,0.0,0,1.0);
      pIVar2 = pIVar6->DrawList;
      font = pIVar5->Font;
      local_a4 = pIVar5->FontSize;
      IVar7 = GetColorU32(0,1.0);
      text = this->Name;
      text_end = FindRenderedTextEnd(text,(char *)0x0);
      ImDrawList::AddText(pIVar2,font,local_a4,&local_98.Min,IVar7,text,text_end,0.0,(ImVec4 *)0x0);
      ppIVar8 = local_68;
      lVar9 = local_70;
      bb = local_60;
    }
  }
  IVar7 = GetColorU32(5,1.0);
  p_max = local_78;
  ImDrawList::AddRect(local_88,&bb->Min,local_78,IVar7,0.0,0,1.0);
  if ((local_80->super_ImGuiViewport).ID == (pIVar5->DebugMetricsConfig).HighlightViewportID) {
    ImDrawList::AddRect(local_a0->DrawList,&bb->Min,p_max,0xff00ffff,0.0,0,1.0);
  }
  return;
}

Assistant:

void ImGui::DebugRenderViewportThumbnail(ImDrawList* draw_list, ImGuiViewportP* viewport, const ImRect& bb)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    ImVec2 scale = bb.GetSize() / viewport->Size;
    ImVec2 off = bb.Min - viewport->Pos * scale;
    float alpha_mul = 1.0f;
    window->DrawList->AddRectFilled(bb.Min, bb.Max, GetColorU32(ImGuiCol_Border, alpha_mul * 0.40f));
    for (ImGuiWindow* thumb_window : g.Windows)
    {
        if (!thumb_window->WasActive || (thumb_window->Flags & ImGuiWindowFlags_ChildWindow))
            continue;

        ImRect thumb_r = thumb_window->Rect();
        ImRect title_r = thumb_window->TitleBarRect();
        thumb_r = ImRect(ImTrunc(off + thumb_r.Min * scale), ImTrunc(off +  thumb_r.Max * scale));
        title_r = ImRect(ImTrunc(off + title_r.Min * scale), ImTrunc(off +  ImVec2(title_r.Max.x, title_r.Min.y + title_r.GetHeight() * 3.0f) * scale)); // Exaggerate title bar height
        thumb_r.ClipWithFull(bb);
        title_r.ClipWithFull(bb);
        const bool window_is_focused = (g.NavWindow && thumb_window->RootWindowForTitleBarHighlight == g.NavWindow->RootWindowForTitleBarHighlight);
        window->DrawList->AddRectFilled(thumb_r.Min, thumb_r.Max, GetColorU32(ImGuiCol_WindowBg, alpha_mul));
        window->DrawList->AddRectFilled(title_r.Min, title_r.Max, GetColorU32(window_is_focused ? ImGuiCol_TitleBgActive : ImGuiCol_TitleBg, alpha_mul));
        window->DrawList->AddRect(thumb_r.Min, thumb_r.Max, GetColorU32(ImGuiCol_Border, alpha_mul));
        window->DrawList->AddText(g.Font, g.FontSize * 1.0f, title_r.Min, GetColorU32(ImGuiCol_Text, alpha_mul), thumb_window->Name, FindRenderedTextEnd(thumb_window->Name));
    }
    draw_list->AddRect(bb.Min, bb.Max, GetColorU32(ImGuiCol_Border, alpha_mul));
    if (viewport->ID == g.DebugMetricsConfig.HighlightViewportID)
        window->DrawList->AddRect(bb.Min, bb.Max, IM_COL32(255, 255, 0, 255));
}